

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O1

uint16_t SharpYuvLinearToGamma(uint32_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  double __y;
  
  bVar3 = (byte)bit_depth;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    iVar2 = (int)kLinearToGammaTabS[((int)v >> 7) + 1] >> (0x10 - bVar3 & 0x1f);
    iVar1 = (int)kLinearToGammaTabS[(uint)((int)v >> 7)] >> (0x10 - bVar3 & 0x1f);
    if (0xf < bit_depth) {
      iVar2 = kLinearToGammaTabS[((int)v >> 7) + 1] << (bVar3 - 0x10 & 0x1f);
      iVar1 = kLinearToGammaTabS[(uint)((int)v >> 7)] << (bVar3 - 0x10 & 0x1f);
    }
    v = ((iVar2 - iVar1) * (v & 0x7f) + 0x40 >> 7) + iVar1;
    goto LAB_0014f151;
  }
  fVar6 = 0.0;
  if (0x11 < transfer_type - kSharpYuvTransferFunctionBt709) goto switchD_0014eeef_caseD_2;
  fVar5 = (float)v / 65535.0;
  fVar6 = 0.0;
  switch(transfer_type) {
  default:
    if (0.01805397 <= fVar5) {
      fVar6 = 1.0;
      if (fVar5 < 1.0) goto LAB_0014ef7c;
    }
    else {
LAB_0014eefe:
      fVar6 = fVar5 * 4.5;
    }
    break;
  case 2:
  case 3:
  case kSharpYuvTransferFunctionSrgb:
    break;
  case kSharpYuvTransferFunctionBt470M:
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    dVar4 = (double)fVar6;
    __y = 0.45454543828964233;
    goto LAB_0014f104;
  case kSharpYuvTransferFunctionBt470Bg:
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    dVar4 = (double)fVar6;
    __y = 0.3571428656578064;
    goto LAB_0014f104;
  case kSharpYuvTransferFunctionSmpte240:
    if (fVar5 < 0.022821585) {
      fVar6 = fVar5 * 4.0;
    }
    else {
      fVar6 = 1.0;
      if (fVar5 < 1.0) {
        dVar4 = pow((double)fVar5,0.44999998807907104);
        fVar6 = (float)dVar4 * 1.1115721 + -0.1115722;
      }
    }
    break;
  case kSharpYuvTransferFunctionLinear:
    goto LAB_0014f151;
  case kSharpYuvTransferFunctionLog100:
    fVar6 = 0.0;
    if (0.01 <= fVar5) {
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      dVar4 = log10((double)fVar5);
      fVar6 = (float)dVar4 * 0.5;
LAB_0014f0df:
      fVar6 = fVar6 + 1.0;
    }
    break;
  case kSharpYuvTransferFunctionLog100_Sqrt10:
    fVar6 = 0.0;
    if (0.0031622776 <= fVar5) {
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      dVar4 = log10((double)fVar5);
      fVar6 = (float)dVar4 / 2.5;
      goto LAB_0014f0df;
    }
    break;
  case kSharpYuvTransferFunctionIec61966:
    if (fVar5 < 0.01805397) goto LAB_0014eefe;
LAB_0014ef7c:
    dVar4 = pow((double)fVar5,0.44999998807907104);
    fVar6 = (float)dVar4 * 1.0992968 + -0.09929682;
    break;
  case kSharpYuvTransferFunctionSmpte2084:
    if (0.0 < fVar5) {
      dVar4 = pow((double)fVar5,0.159423828125);
      dVar4 = (double)(((float)dVar4 * 18.851562 + 0.8359375) / ((float)dVar4 * 18.6875 + 1.0));
      __y = 78.84375;
      goto LAB_0014f104;
    }
    break;
  case kSharpYuvTransferFunctionSmpte428:
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    dVar4 = (double)(fVar5 * 0.9165553);
    __y = 0.38461539149284363;
LAB_0014f104:
    dVar4 = pow(dVar4,__y);
    fVar6 = (float)dVar4;
    break;
  case kSharpYuvTransferFunctionHlg:
    dVar4 = pow((double)fVar5,0.8333333134651184);
    fVar5 = (float)dVar4;
    fVar6 = 0.0;
    if (0.0 <= fVar5) {
      if (fVar5 <= 0.083333336) {
        fVar5 = fVar5 * 3.0;
        if (fVar5 < 0.0) {
          fVar6 = sqrtf(fVar5);
        }
        else {
          fVar6 = SQRT(fVar5);
        }
      }
      else {
        fVar6 = logf(fVar5 * 12.0 + -0.28466892);
        fVar6 = fVar6 * 0.17883277 + 0.5599107;
      }
    }
  }
switchD_0014eeef_caseD_2:
  fVar6 = (float)~(-1 << (bVar3 & 0x1f)) * fVar6;
  if (0.0 <= fVar6) {
    fVar6 = floorf(fVar6 + 0.5);
  }
  else {
    fVar6 = ceilf(fVar6 + -0.5);
  }
  v = (uint32_t)fVar6;
LAB_0014f151:
  return (uint16_t)v;
}

Assistant:

uint16_t SharpYuvLinearToGamma(uint32_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return FromLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << 16) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = FromLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = FromLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = FromLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = FromLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = FromLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = FromLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = FromLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = FromLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = FromLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = FromLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = FromLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint16_t)Roundf(linear * ((1 << bit_depth) - 1));
}